

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStackSizes::SetToContextState(ImGuiStackSizes *this,ImGuiContext *ctx)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiContext *ctx_local;
  ImGuiStackSizes *this_local;
  
  this->SizeOfIDStack = (short)(ctx->CurrentWindow->IDStack).Size;
  this->SizeOfColorStack = (short)(ctx->ColorStack).Size;
  this->SizeOfStyleVarStack = (short)(ctx->StyleVarStack).Size;
  this->SizeOfFontStack = (short)(ctx->FontStack).Size;
  this->SizeOfFocusScopeStack = (short)(ctx->FocusScopeStack).Size;
  this->SizeOfGroupStack = (short)(ctx->GroupStack).Size;
  this->SizeOfItemFlagsStack = (short)(ctx->ItemFlagsStack).Size;
  this->SizeOfBeginPopupStack = (short)(ctx->BeginPopupStack).Size;
  this->SizeOfDisabledStack = ctx->DisabledStackSize;
  return;
}

Assistant:

void ImGuiStackSizes::SetToContextState(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = g.CurrentWindow;
    SizeOfIDStack = (short)window->IDStack.Size;
    SizeOfColorStack = (short)g.ColorStack.Size;
    SizeOfStyleVarStack = (short)g.StyleVarStack.Size;
    SizeOfFontStack = (short)g.FontStack.Size;
    SizeOfFocusScopeStack = (short)g.FocusScopeStack.Size;
    SizeOfGroupStack = (short)g.GroupStack.Size;
    SizeOfItemFlagsStack = (short)g.ItemFlagsStack.Size;
    SizeOfBeginPopupStack = (short)g.BeginPopupStack.Size;
    SizeOfDisabledStack = (short)g.DisabledStackSize;
}